

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall
IRBuilder::BuildReg2
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot R0,RegSlot R1,uint32 nextOffset)

{
  undefined1 *puVar1;
  Type *pTVar2;
  byte bVar3;
  StackSym *pSVar4;
  List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Type pPVar5;
  code *pcVar6;
  OpCode OVar7;
  byte bVar8;
  bool bVar9;
  ValueType valueType;
  RegSlot RVar10;
  uint sourceContextId;
  uint functionId;
  RegOpnd *pRVar11;
  Instr *pIVar12;
  RegOpnd *pRVar13;
  IRBuilder *dstOpnd;
  undefined4 *puVar14;
  GeneratorBailInInstr *instr;
  BailOutInfo *pBVar15;
  JITTimeFunctionBody *pJVar16;
  FunctionJITTimeInfo *this_01;
  LabelInstr *instr_00;
  int iVar17;
  undefined6 in_register_00000032;
  Func *pFVar18;
  StackSym *pSVar19;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_50;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4e;
  uint local_4c;
  Func *local_48;
  RegOpnd *local_40;
  IRBuilder *local_38;
  
  local_40 = (RegOpnd *)CONCAT44(local_40._4_4_,R0);
  local_4c = nextOffset;
  pRVar11 = BuildSrcOpnd(this,R1,TyVar);
  pSVar4 = pRVar11->m_sym;
  iVar17 = (int)CONCAT62(in_register_00000032,newOpcode);
  local_38 = this;
  if (iVar17 < 0x10d) {
    if (iVar17 != 0x46) {
      if (iVar17 == 0xba) {
        dstOpnd = (IRBuilder *)IR::RegOpnd::New(TyVar,this->m_func);
        pIVar12 = IR::Instr::New(LdFrameDisplay,(Opnd *)dstOpnd,&pRVar11->super_Opnd,this->m_func);
        pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        RVar10 = JITTimeFunctionBody::GetEnvReg(pJVar16);
        if (RVar10 != 0xffffffff) {
          pRVar11 = BuildSrcOpnd(this,RVar10,TyVar);
          local_38 = dstOpnd;
          if (pIVar12->m_src2 != (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar14 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src."
                              );
            if (!bVar9) goto LAB_004ca7d0;
            *puVar14 = 0;
          }
          pFVar18 = pIVar12->m_func;
          if ((pRVar11->super_Opnd).isDeleted == true) {
            AssertCount = AssertCount + 1;
            local_48 = pIVar12->m_func;
            Js::Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar14 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x14,"(!isDeleted)","Using deleted operand");
            if (!bVar9) goto LAB_004ca7d0;
            *puVar14 = 0;
            pFVar18 = local_48;
          }
          dstOpnd = local_38;
          bVar8 = (pRVar11->super_Opnd).field_0xb;
          if ((bVar8 & 2) != 0) {
            pRVar11 = (RegOpnd *)IR::Opnd::Copy(&pRVar11->super_Opnd,pFVar18);
            bVar8 = (pRVar11->super_Opnd).field_0xb;
          }
          (pRVar11->super_Opnd).field_0xb = bVar8 | 2;
          pIVar12->m_src2 = &pRVar11->super_Opnd;
        }
        AddInstr(this,pIVar12,offset);
        pRVar11 = BuildSrcOpnd(this,(RegSlot)local_40,TyVar);
        pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        RVar10 = JITTimeFunctionBody::GetLocalFrameDisplayReg(pJVar16);
        pRVar13 = BuildDstOpnd(this,RVar10,TyVar,false,false);
        pIVar12 = IR::Instr::New(LdFrameDisplay,&pRVar13->super_Opnd,&pRVar11->super_Opnd,
                                 (Opnd *)dstOpnd,this->m_func);
        puVar1 = &pRVar13->m_sym->field_0x18;
        *(uint *)puVar1 = *(uint *)puVar1 | 2;
        goto LAB_004ca4c0;
      }
      OVar7 = Typeof;
      if (iVar17 == 0x108) goto LAB_004ca21a;
      goto LAB_004ca26d;
    }
    local_48 = (Func *)pRVar11;
    pRVar13 = BuildDstOpnd(this,(RegSlot)local_40,TyVar,false,true);
    pSVar19 = pRVar13->m_sym;
  }
  else {
    if (iVar17 == 0x10d) {
      OVar7 = UnwrapWithObj;
LAB_004ca21a:
      newOpcode = OVar7;
      local_48 = (Func *)pRVar11;
      pRVar13 = BuildDstOpnd(this,(RegSlot)local_40,TyVar,false,true);
      goto LAB_004ca23d;
    }
    if ((iVar17 == 0x10e) || (iVar17 == 0x182)) {
      pIVar12 = IR::Instr::New(newOpcode,this->m_func);
      pRVar13 = BuildSrcOpnd(this,(RegSlot)local_40,TyVar);
      if (pIVar12->m_src1 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
        if (!bVar9) goto LAB_004ca7d0;
        *puVar14 = 0;
        this = local_38;
      }
      pFVar18 = pIVar12->m_func;
      if ((pRVar13->super_Opnd).isDeleted == true) {
        local_40 = (RegOpnd *)CONCAT44(local_40._4_4_,offset);
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar9) goto LAB_004ca7d0;
        *puVar14 = 0;
        this = local_38;
        offset = (RegSlot)local_40;
      }
      bVar8 = (pRVar13->super_Opnd).field_0xb;
      if ((bVar8 & 2) != 0) {
        pRVar13 = (RegOpnd *)IR::Opnd::Copy(&pRVar13->super_Opnd,pFVar18);
        bVar8 = (pRVar13->super_Opnd).field_0xb;
      }
      (pRVar13->super_Opnd).field_0xb = bVar8 | 2;
      pIVar12->m_src1 = &pRVar13->super_Opnd;
      if (pIVar12->m_src2 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
        if (!bVar9) goto LAB_004ca7d0;
        *puVar14 = 0;
      }
      pFVar18 = pIVar12->m_func;
      if ((pRVar11->super_Opnd).isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar9) goto LAB_004ca7d0;
        *puVar14 = 0;
        this = local_38;
      }
      bVar8 = (pRVar11->super_Opnd).field_0xb;
      if ((bVar8 & 2) != 0) {
        pRVar11 = (RegOpnd *)IR::Opnd::Copy(&pRVar11->super_Opnd,pFVar18);
        bVar8 = (pRVar11->super_Opnd).field_0xb;
      }
      (pRVar11->super_Opnd).field_0xb = bVar8 | 2;
      pIVar12->m_src2 = &pRVar11->super_Opnd;
      goto LAB_004ca4c0;
    }
LAB_004ca26d:
    pRVar13 = BuildDstOpnd(this,(RegSlot)local_40,TyVar,false,false);
    this = local_38;
    pSVar19 = pRVar13->m_sym;
    if (ArgOut_Env < newOpcode) {
      if (newOpcode < LdInnerFrameDisplayNoParent) {
        if (newOpcode == Delete_A) {
          local_48 = (Func *)pRVar11;
          IR::Opnd::SetValueType(&pRVar13->super_Opnd,(ValueType)0x400);
          newOpcode = Delete_A;
          this = local_38;
        }
        else {
          local_48 = (Func *)pRVar11;
          if (newOpcode == LdArrHead) {
            local_4e.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 ValueType::GetObject(Array);
            local_50.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 ValueType::SetHasNoMissingValues((ValueType *)&local_4e.field_0,false);
            valueType = ValueType::SetArrayTypeId((ValueType *)&local_50.field_0,TypeIds_Array);
            IR::Opnd::SetValueType(&pRVar11->super_Opnd,valueType);
            puVar1 = &(pRVar11->super_Opnd).field_0xb;
            *puVar1 = *puVar1 | 1;
            newOpcode = LdArrHead;
            this = local_38;
          }
        }
      }
      else {
        if (newOpcode == LdInnerFrameDisplayNoParent) {
          pIVar12 = IR::Instr::New(LdInnerFrameDisplay,&pRVar13->super_Opnd,&pRVar11->super_Opnd,
                                   local_38->m_func);
          AddEnvOpndForInnerFrameDisplay(this,pIVar12,offset);
          this = local_38;
          if ((*(uint *)&pSVar19->field_0x18 & 1) != 0) {
            *(uint *)&pSVar19->field_0x18 = *(uint *)&pSVar19->field_0x18 | 2;
          }
LAB_004ca4c0:
          AddInstr(this,pIVar12,offset);
          return;
        }
        local_48 = (Func *)pRVar11;
        if (newOpcode == Conv_Str) {
          IR::Opnd::SetValueType(&pRVar13->super_Opnd,(ValueType)0x800);
          newOpcode = Conv_Str;
          this = local_38;
        }
      }
      goto LAB_004ca23d;
    }
    if (newOpcode == BeginSwitch) {
      local_48 = (Func *)pRVar11;
      SwitchIRBuilder::BeginSwitch(&local_38->m_switchBuilder);
      newOpcode = Ld_A;
      goto LAB_004ca23d;
    }
    if (newOpcode == Yield) {
      local_40 = pRVar13;
      bVar9 = JITTimeWorkItem::IsLoopBody(local_38->m_func->m_workItem);
      if (bVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x75c,"(!this->IsLoopBody())",
                           "Attempting to JIT loop body containing Yield");
        if (!bVar9) {
LAB_004ca7d0:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar14 = 0;
      }
      pIVar12 = IR::Instr::New(Yield,&local_40->super_Opnd,&pRVar11->super_Opnd,this->m_func);
      AddInstr(this,pIVar12,offset);
      pIVar12 = IR::Instr::ConvertToBailOutInstr
                          (pIVar12,pIVar12,BailOutForGeneratorYield,0xffffffff);
      this->m_lastInstr = pIVar12;
      instr = IR::GeneratorBailInInstr::New(pIVar12,this->m_func);
      puVar1 = &(instr->super_LabelInstr).field_0x78;
      *puVar1 = *puVar1 | 4;
      (instr->super_LabelInstr).m_name = L"GeneratorBailInLabel";
      AddInstr(this,(Instr *)instr,offset);
      this_00 = this->m_func->m_yieldOffsetResumeLabelList;
      JsUtil::
      List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::EnsureArray(this_00,0);
      pPVar5 = (this_00->
               super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
               ).buffer;
      iVar17 = (this_00->
               super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
               ).count;
      pPVar5[iVar17].first = local_4c;
      pPVar5[iVar17].second = &instr->super_LabelInstr;
      pPVar5[iVar17].initialized = true;
      pTVar2 = &(this_00->
                super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                ).count;
      *pTVar2 = *pTVar2 + 1;
      pBVar15 = IR::Instr::GetBailOutInfo(pIVar12);
      pBVar15->bailInInstr = instr;
      pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar16);
      this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
      functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
      bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailInPhase,sourceContextId,functionId);
      if (bVar9) {
        instr_00 = IR::LabelInstr::New(GeneratorOutputBailInTraceLabel,this->m_func,false);
        instr_00->field_0x78 = instr_00->field_0x78 | 4;
        instr_00->m_name = L"OutputBailInTrace";
        AddInstr(this,&instr_00->super_Instr,offset);
        pIVar12 = IR::Instr::New(GeneratorOutputBailInTrace,this->m_func);
        AddInstr(this,pIVar12,offset);
      }
      pIVar12 = IR::Instr::New(GeneratorResumeYield,&local_40->super_Opnd,this->m_func);
      AddInstr(this,pIVar12,offset);
      bVar9 = Func::IsJitInDebugMode(this->m_func);
      if (!bVar9) {
        return;
      }
      InsertBailOutForDebugger
                (this,offset,BailOutStep|BailOutBreakPointInFunction|BailOutForceByFlag,(Instr *)0x0
                );
      return;
    }
    local_48 = (Func *)pRVar11;
    if (newOpcode != Ld_A) goto LAB_004ca23d;
  }
  bVar3 = (pSVar4->m_builtInIndex)._value;
  newOpcode = Ld_A;
  this = local_38;
  if (bVar3 != 'H') {
    (pSVar19->m_builtInIndex)._value = bVar3;
  }
LAB_004ca23d:
  pIVar12 = IR::Instr::New(newOpcode,&pRVar13->super_Opnd,(Opnd *)local_48,this->m_func);
  AddInstr(this,pIVar12,offset);
  return;
}

Assistant:

void
IRBuilder::BuildReg2(Js::OpCode newOpcode, uint32 offset, Js::RegSlot R0, Js::RegSlot R1, uint32 nextOffset)
{
    IR::RegOpnd *   src1Opnd = this->BuildSrcOpnd(R1);
    StackSym *      symSrc1 = src1Opnd->m_sym;
    bool            reuseLoc = false;

    switch (newOpcode)
    {
    case Js::OpCode::Ld_A_ReuseLoc:
        newOpcode = Js::OpCode::Ld_A;
        reuseLoc = true;
        break;

    case Js::OpCode::Typeof_ReuseLoc:
        newOpcode = Js::OpCode::Typeof;
        reuseLoc = true;
        break;

    case Js::OpCode::UnwrapWithObj_ReuseLoc:
        newOpcode = Js::OpCode::UnwrapWithObj;
        reuseLoc = true;
        break;

    case Js::OpCode::SpreadObjectLiteral:
        // fall through
    case Js::OpCode::SetComputedNameVar:
    {
        IR::Instr *instr = IR::Instr::New(newOpcode, m_func);
        instr->SetSrc1(this->BuildSrcOpnd(R0));
        instr->SetSrc2(src1Opnd);
        this->AddInstr(instr, offset);
        return;
    }
    case Js::OpCode::LdFuncExprFrameDisplay:
    {
        IR::RegOpnd *dstOpnd = IR::RegOpnd::New(TyVar, m_func);
        IR::Instr *instr = IR::Instr::New(Js::OpCode::LdFrameDisplay, dstOpnd, src1Opnd, m_func);
        Js::RegSlot envReg = this->GetEnvReg();
        if (envReg != Js::Constants::NoRegister)
        {
            instr->SetSrc2(BuildSrcOpnd(envReg));
        }
        this->AddInstr(instr, offset);

        IR::RegOpnd *src2Opnd = dstOpnd;
        src1Opnd = BuildSrcOpnd(R0);
        dstOpnd = BuildDstOpnd(m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg());
        instr = IR::Instr::New(Js::OpCode::LdFrameDisplay, dstOpnd, src1Opnd, src2Opnd, m_func);
        dstOpnd->m_sym->m_isNotNumber = true;
        this->AddInstr(instr, offset);
        return;
    }
    }

    IR::RegOpnd *   dstOpnd = this->BuildDstOpnd(R0, TyVar, false, reuseLoc);
    StackSym *      dstSym = dstOpnd->m_sym;

    IR::Instr * instr = nullptr;
    switch (newOpcode)
    {
    case Js::OpCode::Ld_A:
        if (symSrc1->m_builtInIndex != Js::BuiltinFunction::None)
        {
            // Note: don't set dstSym->m_builtInIndex to None here (see Win8 399972)
            dstSym->m_builtInIndex = symSrc1->m_builtInIndex;
        }
        break;

    case Js::OpCode::Delete_A:
        dstOpnd->SetValueType(ValueType::Boolean);
        break;
    case Js::OpCode::BeginSwitch:
        m_switchBuilder.BeginSwitch();
        newOpcode = Js::OpCode::Ld_A;
        break;
    case Js::OpCode::LdArrHead:
        src1Opnd->SetValueType(
            ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(false).SetArrayTypeId(Js::TypeIds_Array));
        src1Opnd->SetValueTypeFixed();
        break;

    case Js::OpCode::LdInnerFrameDisplayNoParent:
    {
        instr = IR::Instr::New(Js::OpCode::LdInnerFrameDisplay, dstOpnd, src1Opnd, m_func);
        this->AddEnvOpndForInnerFrameDisplay(instr, offset);
        if (dstSym->m_isSingleDef)
        {
            dstSym->m_isNotNumber = true;
        }
        this->AddInstr(instr, offset);

        return;
    }

    case Js::OpCode::Conv_Str:
        dstOpnd->SetValueType(ValueType::String);
        break;

    case Js::OpCode::Yield:
        // Jitting Loop Bodies containing Yield is not possible, blocked at callsites of GenerateLoopBody
        AssertMsg(!this->IsLoopBody(), "Attempting to JIT loop body containing Yield");

        instr = IR::Instr::New(newOpcode, dstOpnd, src1Opnd, m_func);
        this->AddInstr(instr, offset);
        IR::Instr* yieldInstr = instr->ConvertToBailOutInstr(instr, IR::BailOutForGeneratorYield);
        this->m_lastInstr = yieldInstr;

        // This label indicates the bail-in section that we will jump to from the generator jump table
        auto* bailInLabel = IR::GeneratorBailInInstr::New(yieldInstr, m_func);
        bailInLabel->m_hasNonBranchRef = true;              // set to true so that we don't move this label around
        LABELNAMESET(bailInLabel, "GeneratorBailInLabel");
        this->AddInstr(bailInLabel, offset);
        this->m_func->AddYieldOffsetResumeLabel(nextOffset, bailInLabel);

        yieldInstr->GetBailOutInfo()->bailInInstr = bailInLabel;

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (PHASE_TRACE(Js::Phase::BailInPhase, this->m_func))
        {
            IR::LabelInstr* traceBailInLabel = IR::LabelInstr::New(Js::OpCode::GeneratorOutputBailInTraceLabel, m_func);
            traceBailInLabel->m_hasNonBranchRef = true;     // set to true so that we don't move this label around
            LABELNAMESET(traceBailInLabel, "OutputBailInTrace");
            this->AddInstr(traceBailInLabel, offset);

            IR::Instr* traceBailIn = IR::Instr::New(Js::OpCode::GeneratorOutputBailInTrace, m_func);
            this->AddInstr(traceBailIn, offset);
        }
#endif

        IR::Instr* resumeYield = IR::Instr::New(Js::OpCode::GeneratorResumeYield, dstOpnd, m_func);
        this->AddInstr(resumeYield, offset);

        if (this->m_func->IsJitInDebugMode())
        {
            this->InsertBailOutForDebugger(offset, IR::BailOutForceByFlag | IR::BailOutBreakPointInFunction | IR::BailOutStep);
        }

        return;
    }

    if (instr == nullptr)
    {
        instr = IR::Instr::New(newOpcode, dstOpnd, src1Opnd, m_func);
    }

    this->AddInstr(instr, offset);
}